

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O0

void on_link_state_changed(void *context,LINK_STATE new_link_state,LINK_STATE previous_link_state)

{
  MESSAGE_RECEIVER_INSTANCE *message_receiver;
  LINK_STATE previous_link_state_local;
  LINK_STATE new_link_state_local;
  void *context_local;
  
  if (new_link_state == LINK_STATE_DETACHED) {
    if ((*(int *)((long)context + 0x18) == 3) || (*(int *)((long)context + 0x18) == 4)) {
      set_message_receiver_state((MESSAGE_RECEIVER_INSTANCE *)context,MESSAGE_RECEIVER_STATE_IDLE);
    }
    else if (*(int *)((long)context + 0x18) != 1) {
      set_message_receiver_state((MESSAGE_RECEIVER_INSTANCE *)context,MESSAGE_RECEIVER_STATE_ERROR);
    }
  }
  else if (new_link_state == LINK_STATE_ATTACHED) {
    if (*(int *)((long)context + 0x18) == 2) {
      set_message_receiver_state((MESSAGE_RECEIVER_INSTANCE *)context,MESSAGE_RECEIVER_STATE_OPEN);
    }
  }
  else if ((new_link_state == LINK_STATE_ERROR) && (*(int *)((long)context + 0x18) != 5)) {
    set_message_receiver_state((MESSAGE_RECEIVER_INSTANCE *)context,MESSAGE_RECEIVER_STATE_ERROR);
  }
  return;
}

Assistant:

static void on_link_state_changed(void* context, LINK_STATE new_link_state, LINK_STATE previous_link_state)
{
    MESSAGE_SENDER_INSTANCE* message_sender = (MESSAGE_SENDER_INSTANCE*)context;
    (void)previous_link_state;

    switch (new_link_state)
    {
    default:
        break;

    case LINK_STATE_ATTACHED:
        if (message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPENING)
        {
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_OPEN);
        }
        break;
    case LINK_STATE_DETACHED:
        if ((message_sender->message_sender_state == MESSAGE_SENDER_STATE_OPEN) ||
            (message_sender->message_sender_state == MESSAGE_SENDER_STATE_CLOSING))
        {
            /* switch to closing so that no more requests should be accepted */
            indicate_all_messages_as_error(message_sender);
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_IDLE);
        }
        else if (message_sender->message_sender_state != MESSAGE_SENDER_STATE_IDLE)
        {
            /* Any other transition must be an error */
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_ERROR);
        }
        break;
    case LINK_STATE_ERROR:
        if (message_sender->message_sender_state != MESSAGE_SENDER_STATE_ERROR)
        {
            indicate_all_messages_as_error(message_sender);
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_ERROR);
        }
        break;
    }
}